

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sys.cpp
# Opt level: O3

Url * __thiscall Vault::Sys::getUrl(Url *__return_storage_ptr__,Sys *this,Path *path)

{
  Client *pCVar1;
  long *local_48 [2];
  long local_38 [2];
  
  pCVar1 = this->client_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"/v1/sys/","");
  (*pCVar1->_vptr_Client[3])(__return_storage_ptr__,pCVar1,local_48,path);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Sys::getUrl(const Path &path) {
  return client_.getUrl("/v1/sys/", path);
}